

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  ushort uVar1;
  uint uVar2;
  ht_slot *phVar3;
  u32 *puVar4;
  u32 uVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  uint uVar9;
  int iHash;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  WalHashLoc sLoc;
  int local_7c;
  WalHashLoc local_48;
  
  uVar2 = (pWal->hdr).mxFrame;
  uVar9 = 0;
  if ((uVar2 != 0) && ((pWal->readLock != 0 || (pWal->bShmUnreliable != '\0')))) {
    uVar10 = (ulong)(uVar2 + 0x1000) + 0xffffffff021 >> 0xc;
    iVar11 = (int)((ulong)(pWal->minFrame + 0x1000) + 0xffffffff021 >> 0xc);
    if (iVar11 <= (int)uVar10) {
      uVar9 = 0;
      do {
        iHash = (int)uVar10;
        iVar6 = walHashGet(pWal,iHash,&local_48);
        uVar5 = local_48.iZero;
        puVar4 = local_48.aPgno;
        phVar3 = local_48.aHash;
        cVar8 = '\x01';
        if (iVar6 == 0) {
          iVar6 = 0x2001;
          uVar12 = pgno * 0x17f & 0x1fff;
          do {
            uVar1 = phVar3[uVar12];
            if (uVar1 == 0) {
              cVar8 = (uVar9 != 0) * '\x02';
              iVar6 = local_7c;
              goto LAB_0014a92d;
            }
            uVar7 = uVar1 + uVar5;
            if (((uVar7 <= uVar2) && (pWal->minFrame <= uVar7)) &&
               (puVar4[(ulong)uVar1 - 1] == pgno)) {
              uVar9 = uVar7;
            }
            if (iVar6 == 1) {
              local_7c = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1021b,
                          "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
            }
            else {
              uVar12 = uVar12 + 1 & 0x1fff;
            }
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          cVar8 = '\x01';
          iVar6 = local_7c;
        }
LAB_0014a92d:
        local_7c = iVar6;
        if (cVar8 != '\0') {
          if (cVar8 != '\x02') {
            return local_7c;
          }
          break;
        }
        uVar10 = (ulong)(iHash - 1);
      } while (iVar11 < iHash);
    }
  }
  *piRead = uVar9;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0,
  ** then the WAL is ignored by the reader so return early, as if the
  ** WAL were empty.
  */
  if( iLast==0 || (pWal->readLock==0 && pWal->bShmUnreliable==0) ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash
  ** table). This means the value just read from the hash
  ** slot (aHash[iKey]) may have been added before or after the
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno):
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast):
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash; iHash--){
    WalHashLoc sLoc;              /* Hash table location */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */
    u32 iH;

    rc = walHashGet(pWal, iHash, &sLoc);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    iKey = walHash(pgno);
    while( (iH = AtomicLoad(&sLoc.aHash[iKey]))!=0 ){
      u32 iFrame = iH + sLoc.iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && sLoc.aPgno[iH-1]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
      iKey = walNextHash(iKey);
    }
    if( iRead ) break;
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->bShmUnreliable || pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame && iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}